

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iexchange.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *ppBVar1;
  pointer *pppLVar2;
  pointer *ppiVar3;
  pointer *ppbVar4;
  pointer *ppiVar5;
  char *__s;
  iterator __position;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  _List_node_base *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  QueuePolicy *q_policy;
  time_t tVar11;
  size_t sVar12;
  Link *l;
  int *b;
  mapped_type *this;
  mapped_type *this_00;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  string_view format_str;
  format_args args;
  int nblocks;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1bf0;
  _List_node_base *local_1be8;
  _List_node_base *local_1be0;
  vector<int,_std::allocator<int>_> gids;
  ContiguousAssigner assigner;
  _Any_data local_1ba8;
  code *local_1b98;
  code *local_1b90;
  _Any_data local_1b80;
  code *local_1b70;
  code *local_1b68;
  communicator world;
  DiscreteBounds domain;
  BoolVector local_1ac8;
  BoolVector local_1a98;
  ulong local_1a68;
  string log_level;
  LoadBlock local_1a40;
  SaveBlock local_1a20;
  DestroyBlock local_1a00;
  CreateBlock local_19e0;
  ulong local_19c0;
  environment env;
  RegularMergePartners merge_partners;
  Options ops;
  DivisionsVector local_1928;
  CoordinateVector local_1908;
  communicator local_18f0;
  long *local_18d8 [2];
  long local_18c8 [2];
  _Any_data local_18b8;
  code *local_18a8;
  code *local_18a0;
  _Any_data local_1898;
  code *local_1888;
  code *local_1880;
  _Any_data local_1878;
  code *local_1868;
  code *local_1860;
  RegularDecomposer<diy::Bounds<int>_> decomposer;
  FileStorage storage;
  _Any_data local_16c8;
  code *local_16b8;
  code *local_16b0;
  _Any_data local_16a8;
  code *local_1698;
  code *local_1690;
  _Any_data local_1688;
  code *local_1678;
  code *local_1670;
  Master master;
  
  decomposer.dim = argc;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(&decomposer,&master,1);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  nblocks = world.size_;
  log_level._M_dataplus._M_p = (pointer)&log_level.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&log_level,"info","");
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  pppLVar2 = &master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"blocks","");
  ppiVar5 = &decomposer.domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  decomposer._0_8_ = ppiVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&decomposer,"number of blocks","");
  opts::Option<int>((opts *)&local_1be0,'b',(string *)&master,&nblocks,(string *)&decomposer);
  p_Var9 = (_List_node_base *)operator_new(0x18);
  p_Var9[1]._M_next = local_1be0;
  local_1be0 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  ppiVar3 = &domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = ppiVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&domain,"log","");
  ppbVar4 = &storage.filename_templates_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)ppbVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&storage,"log level","");
  opts::Option<std::__cxx11::string>
            ((opts *)&local_1be8,'l',(string *)&domain,&log_level,(string *)&storage);
  p_Var9 = (_List_node_base *)operator_new(0x18);
  p_Var9[1]._M_next = local_1be8;
  local_1be8 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_1be8 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1be8 + 8))();
  }
  local_1be8 = (_List_node_base *)0x0;
  if ((pointer *)storage.super_ExternalStorage._vptr_ExternalStorage != ppbVar4) {
    operator_delete(storage.super_ExternalStorage._vptr_ExternalStorage,
                    (ulong)((long)&((storage.filename_templates_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  if ((pointer *)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ != ppiVar3
     ) {
    operator_delete((void *)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_
                    ,(long)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                     + 1);
  }
  if (local_1be0 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1be0 + 8))();
  }
  local_1be0 = (_List_node_base *)0x0;
  if ((pointer *)decomposer._0_8_ != ppiVar5) {
    operator_delete((void *)decomposer._0_8_,
                    (long)decomposer.domain.min.
                          super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin + 1);
  }
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppLVar2) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  bVar8 = opts::Options::parse(&ops,argc,argv);
  if (bVar8) {
    local_18d8[0] = local_18c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_18d8,log_level._M_dataplus._M_p,
               log_level._M_dataplus._M_p + log_level._M_string_length);
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var10->_M_use_count = 1;
    p_Var10->_M_weak_count = 1;
    p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014e218;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    if (local_18d8[0] != local_18c8) {
      operator_delete(local_18d8[0],local_18c8[0] + 1);
    }
    master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&master,"./DIY.XXXXXX","");
    storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)&PTR_put_0014e290;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&storage.filename_templates_,1,(value_type *)&master,(allocator_type *)&decomposer);
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    storage.filenames_.m_.mLock = 0;
    storage.max_size_.x_ = 0;
    storage.max_size_.m_.mLock = 0;
    storage.count_.x_ = 0;
    storage.count_.m_.mLock = 0;
    storage.current_size_.x_ = 0;
    storage.current_size_.m_.mLock = 0;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppLVar2) {
      operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)master.links_.
                            super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    local_18f0.comm_.data = world.comm_.data;
    local_18f0.rank_ = world.rank_;
    local_18f0.size_ = world.size_;
    local_18f0.owner_ = false;
    local_19e0.super__Function_base._M_functor._8_8_ = 0;
    local_19e0.super__Function_base._M_functor._M_unused._M_object = create_block;
    local_19e0._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_19e0.super__Function_base._M_manager =
         std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_1a00.super__Function_base._M_functor._8_8_ = 0;
    local_1a00.super__Function_base._M_functor._M_unused._M_object = destroy_block;
    local_1a00._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_1a00.super__Function_base._M_manager =
         std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_1a20.super__Function_base._M_functor._8_8_ = 0;
    local_1a20.super__Function_base._M_functor._M_unused._M_object = save_block;
    local_1a20._M_invoker =
         std::
         _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_1a20.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    local_1a40.super__Function_base._M_functor._8_8_ = 0;
    local_1a40.super__Function_base._M_functor._M_unused._M_object = load_block;
    local_1a40._M_invoker =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_1a40.super__Function_base._M_manager =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    q_policy = (QueuePolicy *)operator_new(0x10);
    q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_0014e370;
    q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
    diy::Master::Master(&master,&local_18f0,2,-1,&local_19e0,&local_1a00,
                        &storage.super_ExternalStorage,&local_1a20,&local_1a40,q_policy);
    if (local_1a40.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1a40.super__Function_base._M_manager)
                ((_Any_data *)&local_1a40,(_Any_data *)&local_1a40,__destroy_functor);
    }
    if (local_1a20.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1a20.super__Function_base._M_manager)
                ((_Any_data *)&local_1a20,(_Any_data *)&local_1a20,__destroy_functor);
    }
    if (local_1a00.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1a00.super__Function_base._M_manager)
                ((_Any_data *)&local_1a00,(_Any_data *)&local_1a00,__destroy_functor);
    }
    if (local_19e0.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_19e0.super__Function_base._M_manager)
                ((_Any_data *)&local_19e0,(_Any_data *)&local_19e0,__destroy_functor);
    }
    diy::mpi::communicator::~communicator(&local_18f0);
    tVar11 = time((time_t *)0x0);
    srand((int)tVar11 + world.rank_);
    assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    assigner.super_StaticAssigner.super_Assigner.nblocks_ = nblocks;
    assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_0014e3c8;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar19 = nblocks / world.size_;
    iVar14 = nblocks % world.size_;
    iVar15 = iVar19 + 1;
    if (world.rank_ < iVar14) {
      iVar13 = iVar15 * world.rank_;
    }
    else {
      iVar13 = (world.rank_ - iVar14) * iVar19 + iVar14 * iVar15;
    }
    iVar18 = world.rank_ + 1;
    if (iVar18 < iVar14) {
      iVar15 = iVar15 * iVar18;
    }
    else {
      iVar15 = (iVar18 - iVar14) * iVar19 + iVar14 * iVar15;
    }
    decomposer.dim = iVar13;
    if (iVar13 < iVar15) {
      do {
        if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&gids,
                     (iterator)
                     gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&decomposer.dim);
        }
        else {
          *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar13;
          gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar13 = decomposer.dim + 1;
        decomposer.dim = iVar13;
      } while (iVar13 < iVar15);
      if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar17 = 0;
        do {
          iVar19 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
          l = (Link *)operator_new(0x20);
          (l->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0014e448;
          (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (iVar19 < nblocks + -1) {
            decomposer.dim = iVar19 + 1;
            iVar15 = assigner.super_StaticAssigner.super_Assigner.nblocks_ %
                     assigner.super_StaticAssigner.super_Assigner.size_;
            iVar14 = assigner.super_StaticAssigner.super_Assigner.nblocks_ /
                     assigner.super_StaticAssigner.super_Assigner.size_ + 1;
            decomposer._4_4_ = decomposer.dim / iVar14;
            if (iVar15 <= (int)decomposer._4_4_) {
              decomposer._4_4_ =
                   (decomposer.dim - iVar14 * iVar15) /
                   (assigner.super_StaticAssigner.super_Assigner.nblocks_ /
                   assigner.super_StaticAssigner.super_Assigner.size_) + iVar15;
            }
            std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
            _M_realloc_insert<diy::BlockID_const&>
                      ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)&l->neighbors_,
                       (iterator)0x0,(BlockID *)&decomposer);
          }
          if (0 < iVar19) {
            decomposer.dim = iVar19 + -1;
            iVar15 = assigner.super_StaticAssigner.super_Assigner.nblocks_ %
                     assigner.super_StaticAssigner.super_Assigner.size_;
            iVar14 = assigner.super_StaticAssigner.super_Assigner.nblocks_ /
                     assigner.super_StaticAssigner.super_Assigner.size_ + 1;
            decomposer._4_4_ = decomposer.dim / iVar14;
            if (iVar15 <= (int)decomposer._4_4_) {
              decomposer._4_4_ =
                   (decomposer.dim - iVar14 * iVar15) /
                   (assigner.super_StaticAssigner.super_Assigner.nblocks_ /
                   assigner.super_StaticAssigner.super_Assigner.size_) + iVar15;
            }
            __position._M_current =
                 (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
              _M_realloc_insert<diy::BlockID_const&>
                        ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)&l->neighbors_,
                         __position,(BlockID *)&decomposer);
            }
            else {
              (__position._M_current)->gid = decomposer.dim;
              (__position._M_current)->proc = decomposer._4_4_;
              ppBVar1 = &(l->neighbors_).
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppBVar1 = *ppBVar1 + 1;
            }
          }
          b = (int *)operator_new(0x14);
          iVar15 = rand();
          *b = iVar15 % 10 + 1;
          b[1] = 0;
          b[2] = 0;
          b[3] = 0;
          b[4] = 0;
          diy::Master::add(&master,iVar19,b,l);
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 2));
      }
    }
    decomposer._0_8_ = bounce;
    local_16c8._M_unused._M_object = (void *)0x0;
    local_16c8._8_8_ = 0;
    local_16b0 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_16b8 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_16a8._M_unused._M_object = (void *)0x0;
    local_16a8._8_8_ = 0;
    local_1690 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_1698 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1688._M_unused._M_object = (void *)0x0;
    local_1688._8_8_ = 0;
    local_1670 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_1678 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::iexchange<bool(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_bool_Block_ptr_ProxyWithLink_ptr **)&decomposer,
               (MemoryManagement *)&local_16c8);
    if (local_1678 != (code *)0x0) {
      (*local_1678)(&local_1688,&local_1688,__destroy_functor);
    }
    if (local_1698 != (code *)0x0) {
      (*local_1698)(&local_16a8,&local_16a8,__destroy_functor);
    }
    if (local_16b8 != (code *)0x0) {
      (*local_16b8)(&local_16c8,&local_16c8,__destroy_functor);
    }
    decomposer._0_8_ = world._8_8_ & 0xffffffff;
    format_str.size_ = 0x1b;
    format_str.data_ = "[{}]: Checking correctness\n";
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &decomposer;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = 1;
    fmt::v7::vprint(_stdout,format_str,args);
    iVar19 = nblocks;
    diy::Bounds<int>::Bounds(&domain,1);
    *domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin = 0;
    *domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin = iVar19 + -1;
    local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = 0;
    local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._8_8_ = 0;
    local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = 0;
    local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._8_8_ = 0;
    local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_1908.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1908.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1908.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1928.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1928.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1928.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    diy::RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
              (&decomposer,1,&domain,nblocks,&local_1a98,&local_1ac8,&local_1908,&local_1928);
    if (local_1928.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1928.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1928.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1928.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1908.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1908.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1908.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1908.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._8_8_ =
           local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_1ac8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._8_8_ =
           local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_1a98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
         domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
    if (domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
        (pointer)0x0) {
      operator_delete(domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_dynamic_data,
                      domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_dynamic_capacity << 2);
    }
    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
         domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
    if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
        (pointer)0x0) {
      operator_delete(domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_dynamic_data,
                      domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_dynamic_capacity << 2);
    }
    diy::RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
              (&merge_partners.super_RegularPartners,&decomposer,2,false);
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var10->_M_use_count = 1;
    p_Var10->_M_weak_count = 1;
    p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014e218;
    local_1bf0 = p_Var10;
    if (merge_partners.super_RegularPartners.kvs_.
        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        merge_partners.super_RegularPartners.kvs_.
        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar22 = 0;
    }
    else {
      uVar17 = 0;
      uVar16 = 1;
      do {
        local_1ba8._M_unused._M_object = (void *)0x0;
        local_1ba8._8_8_ = 0;
        local_1b90 = std::
                     _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/iexchange.cpp:173:17)>
                     ::_M_invoke;
        local_1b98 = std::
                     _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/iexchange.cpp:173:17)>
                     ::_M_manager;
        uVar22 = (uint)uVar17;
        diy::detail::ReductionFunctor<Block,_diy::RegularMergePartners>::ReductionFunctor
                  ((ReductionFunctor<Block,_diy::RegularMergePartners> *)&domain,uVar22,
                   (Callback *)&local_1ba8,&merge_partners,(Assigner *)&assigner);
        local_1b80._8_8_ = 0;
        local_1b80._M_unused._M_object = operator_new(0x18);
        *(uint *)local_1b80._M_unused._0_8_ = uVar22;
        *(RegularMergePartners **)((long)local_1b80._M_unused._0_8_ + 8) = &merge_partners;
        local_1b68 = std::
                     _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>_>
                     ::_M_invoke;
        local_1b70 = std::
                     _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>_>
                     ::_M_manager;
        diy::Master::foreach<diy::detail::ReductionFunctor<Block,diy::RegularMergePartners>>
                  (&master,(ReductionFunctor<Block,_diy::RegularMergePartners> *)&domain,
                   (Skip *)&local_1b80);
        if (local_1b70 != (code *)0x0) {
          (*local_1b70)(&local_1b80,&local_1b80,__destroy_functor);
        }
        if (domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_static_data._0_8_
            != 0) {
          operator_delete((void *)domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>
                                  .m_static_data._0_8_,
                          domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                          m_dynamic_capacity -
                          domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                          m_static_data._0_8_);
        }
        if (domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ != 0) {
          operator_delete((void *)domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>
                                  ._0_8_,
                          (long)domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                                m_end -
                          domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_);
        }
        if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_static_data._8_8_
            != 0) {
          operator_delete((void *)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>
                                  .m_static_data._8_8_,
                          (long)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                                m_dynamic_data -
                          domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                          m_static_data._8_8_);
        }
        if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_capacity != 0) {
          ppiVar5 = &domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
          (*(code *)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_capacity)
                    (ppiVar5,ppiVar5,3);
        }
        if (local_1b98 != (code *)0x0) {
          (*local_1b98)(&local_1ba8,&local_1ba8,__destroy_functor);
        }
        diy::Master::execute(&master);
        local_1a68 = (ulong)uVar16;
        if ((int)((ulong)((long)master.blocks_.elements_.
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)master.blocks_.elements_.
                               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3) == 0) {
          iVar19 = 0;
        }
        else {
          uVar17 = local_1a68 - 1;
          local_19c0 = (ulong)(uVar22 + 1);
          uVar16 = 0;
          iVar19 = 0;
          do {
            domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = 0;
            domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin =
                 (pointer)0x0;
            domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end = (pointer)0x0;
            diy::RegularDecomposer<diy::Bounds<int>_>::gid_to_coords
                      (master.gids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar16],(DivisionsVector *)&domain,
                       (DivisionsVector *)&merge_partners);
            if (uVar22 < 0x7fffffff) {
              uVar21 = (long)*(int *)(domain.min.
                                      super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_
                                     + (long)(merge_partners.super_RegularPartners.kvs_.
                                              super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->dim * 4) /
                       (long)*merge_partners.super_RegularPartners.steps_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
              if ((int)((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff) %
                       (long)(merge_partners.super_RegularPartners.kvs_.
                              super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                              ._M_impl.super__Vector_impl_data._M_start)->size) == 0) {
                uVar21 = 0;
                do {
                  uVar20 = local_1a68;
                  if (uVar17 == uVar21) break;
                  uVar6 = (long)*(int *)(domain.min.
                                         super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                                         _0_8_ + (long)merge_partners.super_RegularPartners.kvs_.
                                                                                                              
                                                  super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar21 + 1].dim * 4) /
                          (long)merge_partners.super_RegularPartners.steps_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar21 + 1];
                  lVar7 = uVar21 + 1;
                  uVar20 = uVar21 + 1;
                  uVar21 = uVar20;
                } while ((int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff
                                     ) %
                              (long)merge_partners.super_RegularPartners.kvs_.
                                    super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar7].size) == 0);
                operator_delete((void *)domain.min.
                                        super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                                        _0_8_,
                                (long)domain.min.
                                      super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                                - domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>
                                  ._0_8_);
                if (local_19c0 <= uVar20) goto LAB_0010a306;
              }
              else {
                operator_delete((void *)domain.min.
                                        super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                                        _0_8_,
                                (long)domain.min.
                                      super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                                - domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>
                                  ._0_8_);
              }
            }
            else {
              if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ != 0) {
                operator_delete((void *)domain.min.
                                        super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                                        _0_8_,
                                (long)domain.min.
                                      super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                                - domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>
                                  ._0_8_);
              }
LAB_0010a306:
              domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = 0;
              domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin =
                   (pointer)0x0;
              domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
                   (pointer)0x0;
              diy::RegularPartners::fill
                        (&merge_partners.super_RegularPartners,uVar22,
                         master.gids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar16],
                         (vector<int,_std::allocator<int>_> *)&domain);
              uVar21 = (long)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                             m_begin -
                       domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_;
              local_1ba8._0_4_ =
                   master.gids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar16];
              this = std::
                     map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                     ::operator[](&master.incoming_,&master.exchange_round_);
              this_00 = std::
                        map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                        ::operator[](&this->map,(key_type *)local_1ba8._M_pod_data);
              diy::
              concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
              ::clear(this_00);
              if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ != 0) {
                operator_delete((void *)domain.min.
                                        super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                                        _0_8_,
                                (long)domain.min.
                                      super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                                - domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>
                                  ._0_8_);
              }
              iVar19 = iVar19 + (int)(uVar21 >> 2);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < (uint)((ulong)((long)master.blocks_.elements_.
                                                 super__Vector_base<void_*,_std::allocator<void_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)master.blocks_.elements_.
                                                super__Vector_base<void_*,_std::allocator<void_*>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        local_18b8._M_unused._M_object = (void *)0x0;
        local_18b8._8_8_ = 0;
        local_18a0 = std::
                     _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                     ::_M_invoke;
        local_18a8 = std::
                     _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                     ::_M_manager;
        local_1898._M_unused._M_object = (void *)0x0;
        local_1898._8_8_ = 0;
        local_1880 = std::
                     _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                     ::_M_invoke;
        local_1888 = std::
                     _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                     ::_M_manager;
        local_1878._M_unused._M_object = (void *)0x0;
        local_1878._8_8_ = 0;
        local_1860 = std::
                     _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                     ::_M_invoke;
        local_1868 = std::
                     _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                     ::_M_manager;
        master.expected_ = iVar19;
        diy::Master::flush(&master,false,(MemoryManagement *)&local_18b8);
        uVar21 = local_1a68;
        p_Var10 = local_1bf0;
        if (local_1868 != (code *)0x0) {
          (*local_1868)(&local_1878,&local_1878,__destroy_functor);
        }
        if (local_1888 != (code *)0x0) {
          (*local_1888)(&local_1898,&local_1898,__destroy_functor);
        }
        if (local_18a8 != (code *)0x0) {
          (*local_18a8)(&local_18b8,&local_18b8,__destroy_functor);
        }
        uVar22 = uVar22 + 1;
        uVar17 = (ulong)uVar22;
        uVar16 = (int)uVar21 + 1;
      } while (uVar17 < (ulong)((long)merge_partners.super_RegularPartners.kvs_.
                                      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)merge_partners.super_RegularPartners.kvs_.
                                      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    local_1ba8._M_unused._M_object = (void *)0x0;
    local_1ba8._8_8_ = 0;
    local_1b90 = std::
                 _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/iexchange.cpp:173:17)>
                 ::_M_invoke;
    local_1b98 = std::
                 _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/iexchange.cpp:173:17)>
                 ::_M_manager;
    diy::detail::ReductionFunctor<Block,_diy::RegularMergePartners>::ReductionFunctor
              ((ReductionFunctor<Block,_diy::RegularMergePartners> *)&domain,uVar22,
               (Callback *)&local_1ba8,&merge_partners,(Assigner *)&assigner);
    local_1b80._8_8_ = 0;
    local_1b80._M_unused._M_object = operator_new(0x18);
    *(uint *)local_1b80._M_unused._0_8_ = uVar22;
    *(RegularMergePartners **)((long)local_1b80._M_unused._0_8_ + 8) = &merge_partners;
    local_1b68 = std::
                 _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>_>
                 ::_M_invoke;
    local_1b70 = std::
                 _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>_>
                 ::_M_manager;
    diy::Master::foreach<diy::detail::ReductionFunctor<Block,diy::RegularMergePartners>>
              (&master,(ReductionFunctor<Block,_diy::RegularMergePartners> *)&domain,
               (Skip *)&local_1b80);
    if (local_1b70 != (code *)0x0) {
      (*local_1b70)(&local_1b80,&local_1b80,__destroy_functor);
    }
    if (domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_static_data._0_8_ != 0)
    {
      operator_delete((void *)domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                              m_static_data._0_8_,
                      domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_dynamic_capacity -
                      domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_static_data._0_8_);
    }
    if (domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ != 0) {
      operator_delete((void *)domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                              _0_8_,
                      (long)domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                      - domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_);
    }
    if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_static_data._8_8_ != 0)
    {
      operator_delete((void *)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                              m_static_data._8_8_,
                      (long)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                            m_dynamic_data -
                      domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_static_data._8_8_);
    }
    if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_capacity != 0) {
      ppiVar5 = &domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
      (*(code *)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_capacity)
                (ppiVar5,ppiVar5,3);
    }
    if (local_1b98 != (code *)0x0) {
      (*local_1b98)(&local_1ba8,&local_1ba8,__destroy_functor);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    if (merge_partners.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(merge_partners.super_RegularPartners.steps_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)merge_partners.super_RegularPartners.steps_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)merge_partners.super_RegularPartners.steps_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
    if (merge_partners.super_RegularPartners.kvs_.
        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(merge_partners.super_RegularPartners.kvs_.
                      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)merge_partners.super_RegularPartners.kvs_.
                            super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)merge_partners.super_RegularPartners.kvs_.
                            super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (merge_partners.super_RegularPartners.divisions_.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(merge_partners.super_RegularPartners.divisions_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)merge_partners.super_RegularPartners.divisions_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)merge_partners.super_RegularPartners.divisions_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
    diy::RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(&decomposer);
    if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    diy::Master::~Master(&master);
    diy::FileStorage::~FileStorage(&storage);
    iVar19 = 0;
  }
  else {
    iVar19 = 1;
    if (world.rank_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
      __s = *argv;
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1503a0);
      }
      else {
        sVar12 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [OPTIONS]\n",0xb);
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  std::__cxx11::
  _List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ::_M_clear(&ops.options.
              super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ops);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)log_level._M_dataplus._M_p != &log_level.field_2) {
    operator_delete(log_level._M_dataplus._M_p,log_level.field_2._M_allocated_capacity + 1);
  }
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return iVar19;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv);
    diy::mpi::communicator    world;

    // get command line arguments
    int         nblocks     = world.size();
    std::string log_level   = "info";
    using namespace opts;
    Options ops;
    ops
        >> Option('b', "blocks",  nblocks,        "number of blocks")
        >> Option('l', "log",     log_level,      "log level")
    ;
    if (!ops.parse(argc,argv))
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << ops;
        }
        return 1;
    }

    diy::create_logger(log_level);

    diy::FileStorage          storage("./DIY.XXXXXX");

    diy::Master               master(world,
                                     2,
                                     -1,
                                     &create_block,
                                     &destroy_block,
                                     &storage,
                                     &save_block,
                                     &load_block);

    srand(static_cast<unsigned int>(time(NULL) + world.rank()));

    diy::ContiguousAssigner   assigner(world.size(), nblocks);

    // this example creates a linear chain of blocks
    std::vector<int> gids;                     // global ids of local blocks
    assigner.local_gids(world.rank(), gids);   // get the gids of local blocks
    for (size_t i = 0; i < gids.size(); ++i)   // for the local blocks in this processor
    {
        int gid = gids[i];

        diy::Link*   link = new diy::Link;   // link is this block's neighborhood
        diy::BlockID neighbor;               // one neighbor in the neighborhood
        if (gid < nblocks - 1)               // all but the last block in the global domain
        {
            neighbor.gid  = gid + 1;                     // gid of the neighbor block
            neighbor.proc = assigner.rank(neighbor.gid); // process of the neighbor block
            link->add_neighbor(neighbor);                // add the neighbor block to the link
        }
        if (gid > 0)                         // all but the first block in the global domain
        {
            neighbor.gid  = gid - 1;
            neighbor.proc = assigner.rank(neighbor.gid);
            link->add_neighbor(neighbor);
        }

        master.add(gid, new Block(1 + rand() % 10), link);    // add the current local block to the master
    }

    // dequeue, enqueue, exchange all in one nonblocking routine
    master.iexchange(&bounce);

    // alternatively, can hold small messages to reduce communication frequency
    // TODO: add this option to the test once we decide we will keep it
//     master.iexchange(&bounce, 16, 100);

    fmt::print("[{}]: Checking correctness\n", world.rank());

    // check correctness: number of finished particles and hops matches the expected numbers
    diy::RegularDecomposer<diy::DiscreteBounds> decomposer(1, diy::interval(0, nblocks-1), nblocks);
    diy::RegularMergePartners  merge_partners(decomposer, 2, false);
    diy::reduce(master, assigner, merge_partners,
                [](Block*                           b,
                   const diy::ReduceProxy&          rp,
                   const diy::RegularMergePartners&)
                {
                    fmt::print("[{}]: round = {}, entered\n", rp.gid(), rp.round());

                    // step 1: dequeue
                    for (int i = 0; i < rp.in_link().size(); ++i)
                    {
                        int nbr_gid = rp.in_link().target(i).gid;
                        if (nbr_gid == rp.gid())
                            continue;

                        int ep; rp.dequeue(nbr_gid, ep);    b->expected_particles   += ep;
                        int eh; rp.dequeue(nbr_gid, eh);    b->expected_hops        += eh;
                        int fp; rp.dequeue(nbr_gid, fp);    b->finished_particles   += fp;
                        int fh; rp.dequeue(nbr_gid, fh);    b->finished_hops        += fh;
                    }

                    // step 2: enqueue
                    for (int i = 0; i < rp.out_link().size(); ++i)    // redundant since size should equal to 1
                    {
                        // only send to root of group, but not self
                        if (rp.out_link().target(i).gid != rp.gid())
                        {
                            rp.enqueue(rp.out_link().target(i), b->expected_particles);
                            rp.enqueue(rp.out_link().target(i), b->expected_hops);
                            rp.enqueue(rp.out_link().target(i), b->finished_particles);
                            rp.enqueue(rp.out_link().target(i), b->finished_hops);
                        }
                    }

                    if (rp.out_link().size() == 0 && rp.gid() == 0)     // tip of the reduction, check correctness
                    {
                        fmt::print("[{}]: checking correctness, {} vs {}, {} vs {}\n",
                                   rp.gid(),
                                   b->expected_particles, b->finished_particles,
                                   b->expected_hops, b->finished_hops);

                        if (b->expected_particles != b->finished_particles)
                        {
                           fmt::print(stderr, "In block {}, all_expected_particles != all_finished_particles: {} != {}\n",
                                              rp.gid(), b->expected_particles, b->finished_particles);
                           std::abort();
                        }
                        if (b->expected_hops != b->finished_hops)
                        {
                           fmt::print(stderr, "In block {}, all_expected_hops != all_finished_hops: {} != {}\n",
                                              rp.gid(), b->expected_hops, b->finished_hops);
                           std::abort();
                        }
                    }
                    fmt::print("[{}]: round = {}, leaving\n", rp.gid(), rp.round());
                });
}